

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdiarea.cpp
# Opt level: O1

int __thiscall QMdiArea::qt_metacall(QMdiArea *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined8 *puVar1;
  QMdiArea *_t;
  
  _id_00 = QAbstractScrollArea::qt_metacall((QAbstractScrollArea *)this,_c,_id,_a);
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == InvokeMetaMethod) {
    if (_id_00 < 0xe) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
    _id_00 = _id_00 + -0xe;
  }
  if (_c != RegisterMethodArgumentMetaType) goto LAB_0044c3e1;
  if (_id_00 < 0xe) {
    if (_id_00 == 8) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_0044c3de;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
LAB_0044c3de:
  _id_00 = _id_00 + -0xe;
LAB_0044c3e1:
  if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    _id_00 = _id_00 + -8;
  }
  return _id_00;
}

Assistant:

int QMdiArea::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractScrollArea::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
    return _id;
}